

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.h
# Opt level: O2

string * __thiscall dd::Location::ToString_abi_cxx11_(string *__return_storage_ptr__,Location *this)

{
  string *psVar1;
  bool bVar2;
  int iVar3;
  allocator<char> local_169;
  Location *local_168;
  string *local_160;
  string file_name;
  char buf [256];
  
  local_168 = this;
  local_160 = __return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&file_name,this->_file_name,(allocator<char> *)buf);
  iVar3 = (int)file_name._M_string_length + 1;
  do {
    if (iVar3 + -2 < 0) goto LAB_00123151;
    std::__cxx11::string::substr((ulong)buf,(ulong)&file_name);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buf
                            ,"/");
    std::__cxx11::string::~string((string *)buf);
    iVar3 = iVar3 + -1;
  } while (!bVar2);
  std::__cxx11::string::substr((ulong)buf,(ulong)&file_name);
  std::__cxx11::string::operator=((string *)&file_name,(string *)buf);
  std::__cxx11::string::~string((string *)buf);
LAB_00123151:
  memset(buf,0,0x100);
  snprintf(buf,0x100,"%s@%s:%d",local_168->_function_name,file_name._M_dataplus._M_p,
           (ulong)(uint)local_168->_line_number);
  psVar1 = local_160;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_160,buf,&local_169);
  std::__cxx11::string::~string((string *)&file_name);
  return psVar1;
}

Assistant:

std::string ToString()const {
			std::string file_name = _file_name;
			for (int i = file_name.length() - 1; i >= 0; i--)
			{
#ifdef WIN32
				if (file_name.substr(i, 1) == "\\")
#else
				if (file_name.substr(i, 1) == "/")
#endif
				{
					file_name = file_name.substr(i + 1);
					break;
				}
			}

			char buf[256] = { 0 };
			snprintf(buf, sizeof(buf), "%s@%s:%d", _function_name, file_name.c_str(), _line_number);
			return buf;
		}